

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QtDependency>::moveAppend
          (QGenericArrayOps<QtDependency> *this,QtDependency *b,QtDependency *e)

{
  QtDependency *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QtDependency>).ptr;
    qVar5 = (this->super_QArrayDataPointer<QtDependency>).size;
    do {
      pDVar2 = (b->relativePath).d.d;
      (b->relativePath).d.d = (Data *)0x0;
      pQVar1[qVar5].relativePath.d.d = pDVar2;
      pcVar3 = (b->relativePath).d.ptr;
      (b->relativePath).d.ptr = (char16_t *)0x0;
      pQVar1[qVar5].relativePath.d.ptr = pcVar3;
      qVar4 = (b->relativePath).d.size;
      (b->relativePath).d.size = 0;
      pQVar1[qVar5].relativePath.d.size = qVar4;
      pDVar2 = (b->absolutePath).d.d;
      (b->absolutePath).d.d = (Data *)0x0;
      pQVar1[qVar5].absolutePath.d.d = pDVar2;
      pcVar3 = (b->absolutePath).d.ptr;
      (b->absolutePath).d.ptr = (char16_t *)0x0;
      pQVar1[qVar5].absolutePath.d.ptr = pcVar3;
      qVar4 = (b->absolutePath).d.size;
      (b->absolutePath).d.size = 0;
      pQVar1[qVar5].absolutePath.d.size = qVar4;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<QtDependency>).size + 1;
      (this->super_QArrayDataPointer<QtDependency>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }